

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplescene.cpp
# Opt level: O2

int __thiscall graphics101::SimpleScene::init(SimpleScene *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  (*gl3wProcs.ptr[0x96])(0xb71);
  (*gl3wProcs.ptr[0x96])(0xbe2);
  (*gl3wProcs.ptr[0x22])(0x302,0x303);
  loadScene(this,&this->m_scene_path);
  return extraout_EAX;
}

Assistant:

void SimpleScene::init() {
    
    // Turn on some standard OpenGL stuff.
    
    // We want the z-buffer.
    glEnable( GL_DEPTH_TEST );
    
    // Allow alpha blending.
    glEnable( GL_BLEND );
    glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );
    
    this->loadScene( m_scene_path );
}